

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O2

char16_t * PAL_wcscpy(char16_t *strDestination,char16_t *strSource)

{
  long lVar1;
  char16_t *start;
  
  if (PAL_InitializeChakraCoreCalled) {
    if (strSource == (char16_t *)0x0 || strDestination == (char16_t *)0x0) {
      strDestination = (char16_t *)0x0;
    }
    else {
      for (lVar1 = 0; *(short *)((long)strSource + lVar1) != 0; lVar1 = lVar1 + 2) {
        *(short *)((long)strDestination + lVar1) = *(short *)((long)strSource + lVar1);
      }
      *(undefined2 *)((long)strDestination + lVar1) = 0;
    }
    return strDestination;
  }
  abort();
}

Assistant:

char16_t *
__cdecl
PAL_wcscpy(
        char16_t *strDestination,
        const char16_t *strSource)
{
    char16_t *start = strDestination;

    PERF_ENTRY(wcscpy);
    ENTRY("wcscpy (strDestination=%p, strSource=%p (%S))\n",
          strDestination, strSource ? strSource:W16_NULLSTRING, strSource ? strSource:W16_NULLSTRING);

    if (strDestination == NULL)
    {
        ERROR("invalid strDestination argument\n");
        LOGEXIT("wcscpy returning char16_t NULL\n");
        PERF_EXIT(wcscpy);
        return NULL;
    }

    if (strSource == NULL)
    {
        ERROR("invalid strSource argument\n");
        LOGEXIT("wcscpy returning char16_t NULL\n");
        PERF_EXIT(wcscpy);
        return NULL;
    }

    /* copy source string to destination string */
    while(*strSource)
    {
        *strDestination++ = *strSource++;
    }

    /* add terminating null */
    *strDestination = char16_t(0);

    LOGEXIT("wcscpy returning char16_t %p (%S)\n", start, start);
    PERF_EXIT(wcscpy);
    return start;
}